

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int unqliteCreateCollection(unqlite_vm *pVm,SyString *pName)

{
  unqlite_col *puVar1;
  int rc;
  unqlite_col *pCol;
  SyString *pName_local;
  unqlite_vm *pVm_local;
  
  puVar1 = unqliteCollectionFetch(pVm,pName,4);
  if (puVar1 == (unqlite_col *)0x0) {
    pVm_local._4_4_ = unqliteVmLoadCollection(pVm,pName->zString,pName->nByte,1,(unqlite_col **)0x0)
    ;
  }
  else {
    pVm_local._4_4_ = -0xb;
  }
  return pVm_local._4_4_;
}

Assistant:

UNQLITE_PRIVATE int unqliteCreateCollection(
	unqlite_vm *pVm, /* Target VM */
	SyString *pName  /* Collection name */
	)
{
	unqlite_col *pCol;
	int rc;
	/* Perform a lookup first */
	pCol = unqliteCollectionFetch(pVm,pName,UNQLITE_VM_AUTO_LOAD);
	if( pCol ){
		return UNQLITE_EXISTS;
	}
	/* Now, safely create the collection */
	rc = unqliteVmLoadCollection(pVm,pName->zString,pName->nByte,UNQLITE_VM_COLLECTION_CREATE,0);
	return rc;
}